

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS ref_facelift_max_distance(REF_FACELIFT ref_facelift,REF_DBL *distance)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  REF_DBL *pRVar4;
  REF_GEOM pRVar5;
  REF_NODE pRVar6;
  REF_INT *pRVar7;
  double dVar8;
  double dVar9;
  REF_STATUS RVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  
  pRVar4 = ref_facelift->displacement;
  if (pRVar4 == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x51f,"ref_facelift_max_distance","requires indirect facelift");
    RVar10 = 1;
  }
  else {
    pRVar5 = ref_facelift->grid->geom;
    pRVar6 = ref_facelift->grid->node;
    uVar2 = pRVar6->max;
    uVar12 = 0;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = uVar12;
    }
    for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      if (-1 < pRVar6->global[uVar12]) {
        distance[uVar12] = 0.0;
      }
    }
    uVar2 = pRVar5->max;
    RVar10 = 0;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = 0;
    }
    for (lVar13 = 0; uVar11 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
      pRVar7 = pRVar5->descr;
      if (*(int *)((long)pRVar7 + lVar13) != -1) {
        iVar3 = *(int *)((long)pRVar7 + lVar13 + 0x14);
        dVar14 = distance[iVar3];
        pdVar1 = (double *)((long)pRVar4 + lVar13 + 8);
        dVar8 = *pdVar1;
        dVar9 = pdVar1[1];
        if (dVar14 <= SQRT(dVar9 * dVar9 +
                           *(double *)((long)pRVar4 + lVar13) * *(double *)((long)pRVar4 + lVar13) +
                           dVar8 * dVar8)) {
          pdVar1 = (double *)((long)pRVar4 + lVar13 + 8);
          dVar14 = *pdVar1;
          dVar8 = pdVar1[1];
          dVar14 = SQRT(dVar8 * dVar8 +
                        *(double *)((long)pRVar4 + lVar13) * *(double *)((long)pRVar4 + lVar13) +
                        dVar14 * dVar14);
        }
        distance[iVar3] = dVar14;
      }
    }
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_max_distance(REF_FACELIFT ref_facelift,
                                             REF_DBL *distance) {
  REF_GRID ref_grid = ref_facelift_grid(ref_facelift);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_INT geom, node;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  each_ref_node_valid_node(ref_node, node) { distance[node] = 0.0; }

  each_ref_geom(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    distance[node] =
        MAX(distance[node], ref_facelift_distance(ref_facelift, geom));
  }

  return REF_SUCCESS;
}